

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O3

DispatchBuilder * __thiscall kern::DispatchBuilder::format(DispatchBuilder *this,FnFormat *func)

{
  undefined8 *puVar1;
  invalid_argument *this_00;
  
  if (this->inner == (Dispatch *)0x0) {
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar1 = &PTR__exception_00108b70;
    __cxa_throw(puVar1,&BuilderReuseException::typeinfo,std::exception::~exception);
  }
  if ((func->super__Function_base)._M_manager != (_Manager_type)0x0) {
    std::function<void_(const_kern::Metadata_&,_const_char_*,_char_*)>::operator=
              (&this->inner->format_func,func);
    this->inner->is_def_format = false;
    return this;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"function ptr argument is NULL");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

DispatchBuilder &DispatchBuilder::format(FnFormat func) {
        if(this->inner == nullptr)
            throw BuilderReuseException();

        if(func == nullptr)
            throw std::invalid_argument("function ptr argument is NULL");

        this->inner->format_func = func;
        this->inner->is_def_format = false;

        return *this;
    }